

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.cpp
# Opt level: O0

void G_NewInit(void)

{
  uint uVar1;
  int chasecam;
  undefined1 local_60 [8];
  userinfo_t saved_ui;
  player_t *p;
  APlayerPawn *local_38;
  APlayerPawn *next;
  APlayerPawn *pawn;
  TThinkerIterator<APlayerPawn> it;
  int i;
  
  TThinkerIterator<APlayerPawn>::TThinkerIterator((TThinkerIterator<APlayerPawn> *)&pawn,4);
  local_38 = TThinkerIterator<APlayerPawn>::Next((TThinkerIterator<APlayerPawn> *)&pawn);
  while (next = local_38, local_38 != (APlayerPawn *)0x0) {
    local_38 = TThinkerIterator<APlayerPawn>::Next((TThinkerIterator<APlayerPawn> *)&pawn);
    operator|((int)&p + MF_SHOOTABLE,MF_NOSECTOR);
    TFlags<ActorFlag,_unsigned_int>::operator|=(&(next->super_AActor).flags,(Self *)((long)&p + 4));
    (*(next->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
  }
  G_ClearSnapshots();
  ST_SetNeedRefresh();
  netgame = false;
  multiplayer = false;
  if ((demoplayback & 1U) != 0) {
    C_RestoreCVars();
    demoplayback = false;
    D_SetupUserInfo();
  }
  for (it.super_FThinkerIterator._20_4_ = 0; (int)it.super_FThinkerIterator._20_4_ < 8;
      it.super_FThinkerIterator._20_4_ = it.super_FThinkerIterator._20_4_ + 1) {
    saved_ui.super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>._16_8_ =
         &players + (long)(int)it.super_FThinkerIterator._20_4_ * 0x54;
    userinfo_t::userinfo_t((userinfo_t *)local_60);
    TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::TransferFrom
              ((TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_> *)local_60,
               (TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_> *)
               ((long)(int)it.super_FThinkerIterator._20_4_ * 0x2a0 + 0xd63498));
    uVar1 = *(uint *)(saved_ui.
                      super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                      ._16_8_ + 0xe8);
    player_t::~player_t((player_t *)
                        saved_ui.
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                        ._16_8_);
    player_t::player_t((player_t *)
                       saved_ui.
                       super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                       ._16_8_);
    *(uint *)(&DAT_00d63548 + (long)(int)it.super_FThinkerIterator._20_4_ * 0x2a0) =
         *(uint *)(&DAT_00d63548 + (long)(int)it.super_FThinkerIterator._20_4_ * 0x2a0) |
         uVar1 & 0x20;
    (&DAT_00d63468)[(long)(int)it.super_FThinkerIterator._20_4_ * 0x2a0] = 1;
    playeringame[(int)it.super_FThinkerIterator._20_4_] = false;
    TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::TransferFrom
              ((TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_> *)
               ((long)(int)it.super_FThinkerIterator._20_4_ * 0x2a0 + 0xd63498),
               (TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_> *)local_60)
    ;
    userinfo_t::~userinfo_t((userinfo_t *)local_60);
  }
  FString::operator=(&BackupSaveName,"");
  consoleplayer = 0;
  NextSkill = -1;
  return;
}

Assistant:

void G_NewInit ()
{
	int i;

	// Destory all old player refrences that may still exist
	TThinkerIterator<APlayerPawn> it(STAT_TRAVELLING);
	APlayerPawn *pawn, *next;

	next = it.Next();
	while ((pawn = next) != NULL)
	{
		next = it.Next();
		pawn->flags |= MF_NOSECTOR | MF_NOBLOCKMAP;
		pawn->Destroy();
	}

	G_ClearSnapshots ();
	ST_SetNeedRefresh();
	netgame = false;
	multiplayer = false;
	if (demoplayback)
	{
		C_RestoreCVars ();
		demoplayback = false;
		D_SetupUserInfo ();
	}
	for (i = 0; i < MAXPLAYERS; ++i)
	{
		player_t *p = &players[i];
		userinfo_t saved_ui;
		saved_ui.TransferFrom(players[i].userinfo);
		int chasecam = p->cheats & CF_CHASECAM;
		p->~player_t();
		::new(p) player_t;
		players[i].cheats |= chasecam;
		players[i].playerstate = PST_DEAD;
		playeringame[i] = 0;
		players[i].userinfo.TransferFrom(saved_ui);
	}
	BackupSaveName = "";
	consoleplayer = 0;
	NextSkill = -1;
}